

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void * TableSettingsHandler_ReadOpen(ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  int iVar1;
  ImGuiTableSettings *settings_00;
  ImGuiTableSettings *settings;
  int columns_count;
  ImGuiID id;
  char *name_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *param_0_local;
  
  settings._4_4_ = 0;
  settings._0_4_ = 0;
  _columns_count = name;
  name_local = (char *)param_2;
  param_1_local = (ImGuiSettingsHandler *)param_1;
  iVar1 = __isoc99_sscanf(name,"0x%08X,%d",(long)&settings + 4,&settings);
  if (iVar1 < 2) {
    param_0_local = (ImGuiContext *)0x0;
  }
  else {
    settings_00 = ImGui::TableSettingsFindByID(settings._4_4_);
    if (settings_00 != (ImGuiTableSettings *)0x0) {
      if ((int)settings <= settings_00->ColumnsCountMax) {
        InitTableSettings(settings_00,settings._4_4_,(int)settings,(int)settings_00->ColumnsCountMax
                         );
        return settings_00;
      }
      settings_00->ID = 0;
    }
    param_0_local = (ImGuiContext *)ImGui::TableSettingsCreate(settings._4_4_,(int)settings);
  }
  return param_0_local;
}

Assistant:

static void* TableSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiID id = 0;
    int columns_count = 0;
    if (sscanf(name, "0x%08X,%d", &id, &columns_count) < 2)
        return NULL;

    if (ImGuiTableSettings* settings = ImGui::TableSettingsFindByID(id))
    {
        if (settings->ColumnsCountMax >= columns_count)
        {
            InitTableSettings(settings, id, columns_count, settings->ColumnsCountMax); // Recycle
            return settings;
        }
        settings->ID = 0; // Invalidate storage if we won't fit because of a count change
    }
    return ImGui::TableSettingsCreate(id, columns_count);
}